

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

int lj_ffh_tonumber(lua_State *L)

{
  byte bVar1;
  CType *pCVar2;
  int32_t __base;
  StrScanFmt SVar3;
  uint uVar4;
  GCstr *in_RAX;
  TValue *pTVar5;
  GCstr *pGVar6;
  ulong uVar7;
  ulong uVar8;
  CTState *cts;
  TValue *o;
  undefined1 auVar9 [16];
  GCstr *local_28;
  
  o = L->base;
  pTVar5 = L->top;
  if ((o + 1 < pTVar5) && (*(int *)((long)o + 0xc) != -1)) {
    local_28 = in_RAX;
    __base = lj_lib_checkint(L,2);
    if (__base != 10) {
      pGVar6 = lj_lib_checkstr(L,1);
      if (__base - 0x25U < 0xffffffdd) {
        lj_err_arg(L,2,LJ_ERR_BASERNG);
      }
      uVar7 = strtoul((char *)(pGVar6 + 1),(char **)&local_28,__base);
      if (pGVar6 + 1 != local_28) {
        do {
          bVar1 = (byte)(local_28->nextgc).gcptr32;
          local_28 = (GCstr *)((long)&(local_28->nextgc).gcptr32 + 1);
        } while ((""[(ulong)bVar1 + 1] & 2) != 0);
        if (bVar1 == 0) {
          auVar9._8_4_ = (int)(uVar7 >> 0x20);
          auVar9._0_8_ = uVar7;
          auVar9._12_4_ = 0x45300000;
          L->base[-1].n =
               (auVar9._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0);
          return 2;
        }
      }
      goto LAB_00141e26;
    }
    o = L->base;
    pTVar5 = L->top;
  }
  if (pTVar5 <= o) {
    lj_err_arg(L,1,LJ_ERR_NOVAL);
  }
  uVar4 = (o->field_2).it;
  pTVar5 = o;
  if (0xfffeffff < uVar4) {
    if (uVar4 == 0xfffffffb) {
      SVar3 = lj_strscan_scan((uint8_t *)((ulong)(o->u32).lo + 0x10),o,2);
      if (SVar3 != STRSCAN_ERROR) {
        pTVar5 = L->base;
        goto LAB_00141ce8;
      }
      uVar4 = (o->field_2).it;
    }
    if (uVar4 == 0xfffffff5) {
      cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0xfc);
      cts->L = L;
      uVar7 = (ulong)*(ushort *)((ulong)(o->u32).lo + 6);
      pCVar2 = cts->tab;
      do {
        uVar8 = uVar7 * 0x10;
        uVar4 = pCVar2[uVar7].info;
        uVar7 = (ulong)(uVar4 & 0xffff);
      } while ((uVar4 & 0xf0800000) == 0x20800000);
      uVar7 = (ulong)((uVar4 & 0xffff) << 4);
      if ((uVar4 & 0xf0000000) != 0x50000000) {
        uVar7 = uVar8;
      }
      uVar4 = *(uint *)((long)&pCVar2->info + uVar7);
      if (uVar4 < 0x10000000 || (uVar4 & 0xf4000000) == 0x34000000) {
        lj_cconv_ct_tv(cts,pCVar2 + 0xe,(uint8_t *)&L->base[-1].u64,o,0);
        return 2;
      }
    }
LAB_00141e26:
    *(undefined4 *)((long)L->base + -4) = 0xffffffff;
    return 2;
  }
LAB_00141ce8:
  pTVar5[-1].u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)o;
  return 2;
}

Assistant:

LJLIB_ASM(tonumber)		LJLIB_REC(.)
{
  int32_t base = lj_lib_optint(L, 2, 10);
  if (base == 10) {
    TValue *o = lj_lib_checkany(L, 1);
    if (lj_strscan_numberobj(o)) {
      copyTV(L, L->base-1, o);
      return FFH_RES(1);
    }
#if LJ_HASFFI
    if (tviscdata(o)) {
      CTState *cts = ctype_cts(L);
      CType *ct = lj_ctype_rawref(cts, cdataV(o)->ctypeid);
      if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
      if (ctype_isnum(ct->info) || ctype_iscomplex(ct->info)) {
	if (LJ_DUALNUM && ctype_isinteger_or_bool(ct->info) &&
	    ct->size <= 4 && !(ct->size == 4 && (ct->info & CTF_UNSIGNED))) {
	  int32_t i;
	  lj_cconv_ct_tv(cts, ctype_get(cts, CTID_INT32), (uint8_t *)&i, o, 0);
	  setintV(L->base-1, i);
	  return FFH_RES(1);
	}
	lj_cconv_ct_tv(cts, ctype_get(cts, CTID_DOUBLE),
		       (uint8_t *)&(L->base-1)->n, o, 0);
	return FFH_RES(1);
      }
    }
#endif
  } else {
    const char *p = strdata(lj_lib_checkstr(L, 1));
    char *ep;
    unsigned long ul;
    if (base < 2 || base > 36)
      lj_err_arg(L, 2, LJ_ERR_BASERNG);
    ul = strtoul(p, &ep, base);
    if (p != ep) {
      while (lj_char_isspace((unsigned char)(*ep))) ep++;
      if (*ep == '\0') {
	if (LJ_DUALNUM && LJ_LIKELY(ul < 0x80000000u))
	  setintV(L->base-1, (int32_t)ul);
	else
	  setnumV(L->base-1, (lua_Number)ul);
	return FFH_RES(1);
      }
    }
  }
  setnilV(L->base-1);
  return FFH_RES(1);
}